

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O0

err_t cmdSigVerify(char *name,char *sig_name,octet *pubkey,size_t pubkey_len)

{
  bool_t bVar1;
  char *drop_00;
  octet *certs;
  char *certs_len;
  bign_params *params_00;
  bign_params *pbVar2;
  char *oid;
  octet *in_RCX;
  octet *in_RDX;
  octet *in_RSI;
  octet *in_RDI;
  bign_params *unaff_retaddr;
  size_t cert_len;
  size_t offset;
  size_t drop;
  octet *hash;
  size_t oid_len;
  octet *oid_der;
  bign_params *params;
  btok_cvc_t *cvc;
  cmd_sig_t *sig;
  void *stack;
  err_t code;
  size_t in_stack_ffffffffffffff68;
  size_t *in_stack_ffffffffffffff70;
  bign_params *in_stack_ffffffffffffff78;
  size_t *in_stack_ffffffffffffff80;
  cmd_sig_t *in_stack_ffffffffffffff88;
  bign_params *in_stack_ffffffffffffff90;
  bign_params *params_01;
  octet *pubkey_00;
  char *name_00;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar3;
  
  pubkey_00 = &DAT_00000010;
  bVar1 = strIsValid((char *)in_stack_ffffffffffffff70);
  if ((((bVar1 == 0) || (bVar1 = strIsValid((char *)in_stack_ffffffffffffff70), bVar1 == 0)) ||
      ((in_RCX != (octet *)0x30 &&
       (((in_RCX != (octet *)0x40 && (in_RCX != (octet *)0x60)) && (in_RCX != (octet *)0x80)))))) ||
     (bVar1 = memIsValid(in_RDX,(size_t)in_RCX), bVar1 == 0)) {
    eVar3 = 0x6d;
  }
  else {
    drop_00 = (char *)blobCreate(in_stack_ffffffffffffff68);
    eVar3 = 0x6e;
    if (drop_00 != (char *)0x0) {
      eVar3 = 0;
    }
    if (eVar3 == 0) {
      certs = (octet *)(drop_00 + 0x630);
      certs_len = drop_00 + 0x758;
      params_00 = (bign_params *)(drop_00 + 0x8a8);
      params_01 = (bign_params *)(pubkey_00 + (long)(params_00->p + -8));
      name_00 = drop_00;
      eVar3 = cmdSigRead(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         (char *)in_stack_ffffffffffffff78);
      if (eVar3 == 0) {
        bVar1 = cmdFileAreSame((char *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
        pbVar2 = in_stack_ffffffffffffff90;
        if (bVar1 == 0) {
          pbVar2 = (bign_params *)cmdFileSize((char *)in_stack_ffffffffffffff88);
          eVar3 = 0x132;
          if (in_stack_ffffffffffffff90 == pbVar2) {
            eVar3 = 0;
          }
          if (eVar3 != 0) {
            blobClose((blob_t)0x109da2);
            return eVar3;
          }
          pbVar2 = (bign_params *)0x0;
          in_stack_ffffffffffffff78 = in_stack_ffffffffffffff90;
        }
        eVar3 = cmdCVCsVal((octet *)params_01,(size_t)pbVar2,in_stack_ffffffffffffff88->sig);
        if (eVar3 == 0) {
          if (*(long *)(drop_00 + 0x620) != 0) {
            eVar3 = cmdCVCsGetLast((size_t *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                   (octet *)in_stack_ffffffffffffff78,
                                   (size_t)in_stack_ffffffffffffff70);
            if (eVar3 != 0) {
              blobClose((blob_t)0x109e52);
              return eVar3;
            }
            eVar3 = btokCVCUnwrap((btok_cvc_t *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                  in_RDI,(size_t)in_RSI,in_RDX,(size_t)in_RCX);
            if (eVar3 != 0) {
              blobClose((blob_t)0x109e9c);
              return eVar3;
            }
            if ((in_RCX != *(octet **)(certs + 0xa0)) ||
               (bVar1 = memEq(in_RDX,certs + 0x1a,(size_t)in_RCX), bVar1 == 0)) {
              eVar3 = 0x1f9;
            }
            if (eVar3 != 0) {
              blobClose((blob_t)0x109ef5);
              return eVar3;
            }
          }
          eVar3 = cmdSigParamsStd(in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
          if (eVar3 == 0) {
            oid = drop_00 + 0x628;
            eVar3 = cmdSigHash(in_RCX,(ulong)in_stack_ffffffffffffffd0,name_00,(size_t)drop_00,certs
                               ,(size_t)certs_len,in_RDI);
            if (eVar3 == 0) {
              if (in_RCX < (octet *)0x41) {
                eVar3 = bignOidToDER((octet *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                     oid);
                if (eVar3 != 0) {
                  blobClose((blob_t)0x109fd9);
                  return eVar3;
                }
              }
              else {
                eVar3 = bignOidToDER((octet *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                     oid);
                if (eVar3 != 0) {
                  blobClose((blob_t)0x10a02a);
                  return eVar3;
                }
              }
              if (in_RCX == (octet *)0x30) {
                eVar3 = bign96PubkeyVal(params_01,(octet *)pbVar2);
              }
              else {
                eVar3 = bignPubkeyVal(params_00,pubkey_00);
              }
              if (eVar3 == 0) {
                if (in_RCX == (octet *)0x30) {
                  eVar3 = bign96Verify((bign_params *)
                                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                       ,in_RDI,(size_t)in_RSI,in_RDX,(octet *)0x30,
                                       (octet *)(ulong)in_stack_ffffffffffffffd0);
                }
                else {
                  eVar3 = bignVerify(unaff_retaddr,
                                     (octet *)CONCAT44(in_stack_fffffffffffffffc,
                                                       in_stack_fffffffffffffff8),(size_t)in_RDI,
                                     in_RSI,in_RDX,in_RCX);
                }
                blobClose((blob_t)0x10a0ec);
              }
              else {
                blobClose((blob_t)0x10a07d);
              }
            }
            else {
              blobClose((blob_t)0x109f96);
            }
          }
          else {
            blobClose((blob_t)0x109f2e);
          }
        }
        else {
          blobClose((blob_t)0x109df6);
        }
      }
      else {
        blobClose((blob_t)0x109d37);
      }
    }
  }
  return eVar3;
}

Assistant:

err_t cmdSigVerify(const char* name, const char* sig_name,
	const octet pubkey[], size_t pubkey_len)
{
	err_t code;
	void* stack;
	cmd_sig_t* sig;
	btok_cvc_t* cvc;
	bign_params* params;
	octet* oid_der;
	size_t oid_len = 16;
	octet* hash;
	size_t drop;
	// входной контроль
	if (!strIsValid(name) || !strIsValid(sig_name) ||
		!(pubkey_len == 48 || pubkey_len == 64 || pubkey_len == 96 || 
			pubkey_len == 128) ||
		!memIsValid(pubkey, pubkey_len))
		return ERR_BAD_INPUT;
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(cmd_sig_t) + sizeof(btok_cvc_t) +
		sizeof(bign_params) + oid_len + pubkey_len / 2);
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	cvc = (btok_cvc_t*)(sig + 1);
	params = (bign_params*)(cvc + 1);
	oid_der = (octet*)(params + 1);
	hash = oid_der + oid_len;
	// читать подпись
	code = cmdSigRead(sig, &drop, sig_name);	
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// подпись в отдельном файле?
	if (!cmdFileAreSame(name, sig_name))
	{
		code = drop == cmdFileSize(sig_name) ? ERR_OK : ERR_BAD_FORMAT;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		drop = 0;
	}
	// проверить сертификаты
	code = cmdCVCsVal(sig->certs, sig->certs_len, sig->date);	
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// есть сертификаты?
	if (sig->certs_len)
	{
		size_t offset;
		size_t cert_len;
		// найти и разобрать последний сертификат
		code = cmdCVCsGetLast(&offset, &cert_len, sig->certs, sig->certs_len);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		code = btokCVCUnwrap(cvc, sig->certs + offset, cert_len, 0, 0);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить открытый ключ последнего сертификата
		if (pubkey_len != cvc->pubkey_len ||
			!memEq(pubkey, cvc->pubkey, pubkey_len))
			code = ERR_BAD_PUBKEY;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	}
	// загрузить долговременные параметры
	code = cmdSigParamsStd(params, pubkey_len / 2);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// хэшировать
	code = cmdSigHash(hash, pubkey_len / 2, name, drop, sig->certs, 
		sig->certs_len, sig->date);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	if (pubkey_len <= 64)
	{
		code = bignOidToDER(oid_der, &oid_len, "1.2.112.0.2.0.34.101.31.81");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	else 
	{
		code = bignOidToDER(oid_der, &oid_len, pubkey_len == 96 ? 
			"1.2.112.0.2.0.34.101.77.12" : "1.2.112.0.2.0.34.101.77.13");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	// проверить открытый ключ
	if (pubkey_len == 48)
		code = bign96PubkeyVal(params, pubkey);
	else
		code = bignPubkeyVal(params, pubkey);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить подпись
	if (pubkey_len == 48)
		code = bign96Verify(params, oid_der, oid_len, hash, sig->sig, pubkey);
	else
		code = bignVerify(params, oid_der, oid_len, hash, sig->sig, pubkey);
	// завершить
	cmdBlobClose(stack);
	return code;
}